

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O1

void duckdb_lz4::LZ4_memcpy_using_offset(BYTE *dstPtr,BYTE *srcPtr,BYTE *dstEnd,size_t offset)

{
  uint uVar1;
  int iVar2;
  BYTE *s;
  BYTE *pBVar3;
  BYTE *pBVar4;
  
  if (offset == 4) {
    iVar2 = *(int *)srcPtr;
  }
  else if (offset == 2) {
    iVar2 = CONCAT22(*(undefined2 *)srcPtr,*(undefined2 *)srcPtr);
  }
  else {
    if (offset != 1) {
      if (offset < 8) {
        dstPtr[0] = '\0';
        dstPtr[1] = '\0';
        dstPtr[2] = '\0';
        dstPtr[3] = '\0';
        *dstPtr = *srcPtr;
        dstPtr[1] = srcPtr[1];
        dstPtr[2] = srcPtr[2];
        dstPtr[3] = srcPtr[3];
        uVar1 = *(uint *)(inc32table + offset * 4);
        *(undefined4 *)(dstPtr + 4) = *(undefined4 *)(srcPtr + uVar1);
        pBVar3 = srcPtr + ((ulong)uVar1 - (long)*(int *)(dec64table + offset * 4));
      }
      else {
        *(undefined8 *)dstPtr = *(undefined8 *)srcPtr;
        pBVar3 = srcPtr + 8;
      }
      pBVar4 = dstPtr + 8;
      do {
        *(undefined8 *)pBVar4 = *(undefined8 *)pBVar3;
        pBVar4 = pBVar4 + 8;
        pBVar3 = pBVar3 + 8;
      } while (pBVar4 < dstEnd);
      return;
    }
    iVar2 = (uint)*srcPtr * 0x1010101;
  }
  do {
    *(int *)dstPtr = iVar2;
    *(int *)((long)dstPtr + 4) = iVar2;
    dstPtr = (BYTE *)((long)dstPtr + 8);
  } while (dstPtr < dstEnd);
  return;
}

Assistant:

LZ4_FORCE_INLINE void
LZ4_memcpy_using_offset(BYTE* dstPtr, const BYTE* srcPtr, BYTE* dstEnd, const size_t offset)
{
    BYTE v[8];

    assert(dstEnd >= dstPtr + MINMATCH);

    switch(offset) {
    case 1:
        MEM_INIT(v, *srcPtr, 8);
        break;
    case 2:
        LZ4_memcpy(v, srcPtr, 2);
        LZ4_memcpy(&v[2], srcPtr, 2);
#if defined(_MSC_VER) && (_MSC_VER <= 1933) /* MSVC 2022 ver 17.3 or earlier */
#  pragma warning(push)
#  pragma warning(disable : 6385) /* warning C6385: Reading invalid data from 'v'. */
#endif
        LZ4_memcpy(&v[4], v, 4);
#if defined(_MSC_VER) && (_MSC_VER <= 1933) /* MSVC 2022 ver 17.3 or earlier */
#  pragma warning(pop)
#endif
        break;
    case 4:
        LZ4_memcpy(v, srcPtr, 4);
        LZ4_memcpy(&v[4], srcPtr, 4);
        break;
    default:
        LZ4_memcpy_using_offset_base(dstPtr, srcPtr, dstEnd, offset);
        return;
    }

    LZ4_memcpy(dstPtr, v, 8);
    dstPtr += 8;
    while (dstPtr < dstEnd) {
        LZ4_memcpy(dstPtr, v, 8);
        dstPtr += 8;
    }
}